

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# P33x.h
# Opt level: O0

int GetPressureP33x(P33X *pP33x,double *pPressure)

{
  int iVar1;
  float local_24;
  double *pdStack_20;
  float fValue;
  double *pPressure_local;
  P33X *pP33x_local;
  
  local_24 = 0.0;
  pdStack_20 = pPressure;
  pPressure_local = (double *)pP33x;
  iVar1 = ReadChannelP33x(pP33x,'\x01',&local_24);
  if (iVar1 == 0) {
    *pdStack_20 = (double)local_24;
    pPressure_local[100] = *pdStack_20;
  }
  pP33x_local._4_4_ = (uint)(iVar1 != 0);
  return pP33x_local._4_4_;
}

Assistant:

inline int GetPressureP33x(P33X* pP33x, double* pPressure)
{
	float fValue = 0;

	if (ReadChannelP33x(pP33x, PRESSURE_CHANNEL_P33X, &fValue) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}

	*pPressure = (double)fValue;

	pP33x->LastPressure = *pPressure;

	return EXIT_SUCCESS;
}